

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O3

amqp_boolean_t amqp_method_has_content(amqp_method_number_t methodNumber)

{
  if ((methodNumber - 0x3c0028 < 0x20) &&
     ((0x80100401U >> (methodNumber - 0x3c0028 & 0x1f) & 1) != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

amqp_boolean_t amqp_method_has_content(amqp_method_number_t methodNumber) {
  switch (methodNumber) {
    case AMQP_BASIC_PUBLISH_METHOD:
      return 1;
    case AMQP_BASIC_RETURN_METHOD:
      return 1;
    case AMQP_BASIC_DELIVER_METHOD:
      return 1;
    case AMQP_BASIC_GET_OK_METHOD:
      return 1;
    default:
      return 0;
  }
}